

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandTrace(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_3c;
  uint local_38;
  int fVerbose;
  int fUseLutLib;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_38 = 0;
  local_3c = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"lvh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar1 = Abc_NtkIsLogic(pNtk_00);
        if (iVar1 == 0) {
          Abc_Print(-1,"This command can only be applied to a logic network.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          Abc_NtkDelayTracePrint(pNtk_00,local_38,local_3c);
          pAbc_local._4_4_ = 0;
        }
      }
      return pAbc_local._4_4_;
    }
    if (iVar1 == 0x68) break;
    if (iVar1 == 0x6c) {
      local_38 = local_38 ^ 1;
    }
    else {
      if (iVar1 != 0x76) break;
      local_3c = local_3c ^ 1;
    }
  }
  Abc_Print(-2,"usage: trace [-lvh]\n");
  Abc_Print(-2,"\t           performs delay trace of LUT-mapped network\n");
  pcVar2 = "unit";
  if (local_38 != 0) {
    pcVar2 = "lib";
  }
  Abc_Print(-2,"\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n",pcVar2)
  ;
  pcVar2 = "no";
  if (local_3c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandTrace( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseLutLib;
    int fVerbose;
    extern void Abc_NtkDelayTracePrint( Abc_Ntk_t * pNtk, int fUseLutLib, int fVerbose );

    // set defaults
    fUseLutLib = 0;
    fVerbose   = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }

    // modify the current network
    Abc_NtkDelayTracePrint( pNtk, fUseLutLib, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: trace [-lvh]\n" );
    Abc_Print( -2, "\t           performs delay trace of LUT-mapped network\n" );
    Abc_Print( -2, "\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n", fUseLutLib? "lib": "unit" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}